

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SetPropertyScoped<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout,
          PropertyOperationFlags flags)

{
  ImplicitCallFlags flags_00;
  bool bVar1;
  uint16 uVar2;
  PropertyId propertyId_00;
  ScriptContext *pSVar3;
  ThreadContext *this_00;
  FrameDisplay *this_01;
  InlineCache *inlineCache_00;
  Var propertyValue;
  void *aValue;
  FunctionBody *functionBody;
  undefined1 local_a0 [8];
  PropertyValueInfo info;
  RecyclableObject *obj;
  int length;
  Var value;
  ScriptContext *scriptContext;
  InlineCache *inlineCache;
  FrameDisplay *pScope;
  PropertyId propertyId;
  ImplicitCallFlags savedImplicitCallFlags;
  ThreadContext *threadContext;
  PropertyOperationFlags flags_local;
  OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pSVar3 = GetScriptContext(this);
  this_00 = ScriptContext::GetThreadContext(pSVar3);
  flags_00 = ThreadContext::GetImplicitCallFlags(this_00);
  ThreadContext::ClearImplicitCallFlags(this_00);
  propertyId_00 = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  this_01 = GetEnvForEvalCode(this);
  inlineCache_00 = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  pSVar3 = GetScriptContext(this);
  propertyValue = GetReg<unsigned_short>(this,playout->Value);
  uVar2 = FrameDisplay::GetLength(this_01);
  if (uVar2 == 1) {
    aValue = FrameDisplay::GetItem(this_01,0);
    info._56_8_ = VarTo<Js::RecyclableObject>(aValue);
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_a0);
    functionBody = GetFunctionBody(this);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_a0,functionBody,inlineCache_00,
               (uint)playout->inlineCacheIndex,true);
    bVar1 = CacheOperators::TrySetProperty<true,false,false,false,false,true,false,false>
                      ((RecyclableObject *)info._56_8_,false,propertyId_00,propertyValue,pSVar3,
                       flags,(PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_a0);
    if (bVar1) {
      ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
      ThreadContext::AddImplicitCallFlags(this_00,flags_00);
      return;
    }
  }
  OP_SetPropertyScoped_NoFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
            (this,playout,flags);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  ThreadContext::AddImplicitCallFlags(this_00,flags_00);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetPropertyScoped(unaligned T* playout, PropertyOperationFlags flags)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        // Set the property, using a scope stack rather than an individual instance.
        // Use the cache
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        FrameDisplay *pScope = this->GetEnvForEvalCode();
        InlineCache *inlineCache = GetInlineCache(playout->inlineCacheIndex);
        ScriptContext* scriptContext = GetScriptContext();
        Var value = GetReg(playout->Value);

        int length = pScope->GetLength();
        if (1 == length)
        {
            RecyclableObject* obj = VarTo<RecyclableObject>(pScope->GetItem(0));
            PropertyValueInfo info;
            PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
            if (CacheOperators::TrySetProperty<true, false, false, false, false, true, false, false>(
                obj, false, propertyId, value, scriptContext, flags, nullptr, &info))
            {
                threadContext->CheckAndResetImplicitCallAccessorFlag();
                threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
                return;
            }
        }

        OP_SetPropertyScoped_NoFastPath(playout, flags);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }